

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

void __thiscall CLI::Range::Range<int>(Range *this,int min_val,int max_val,string *validator_name)

{
  ostream *poVar1;
  stringstream out;
  string local_1f0;
  string local_1d0;
  anon_class_8_2_9d22b477 local_1b0 [2];
  ostream local_1a0 [376];
  
  ::std::__cxx11::string::string((string *)&local_1d0,(string *)validator_name);
  Validator::Validator(&this->super_Validator,&local_1d0);
  ::std::__cxx11::string::~string((string *)&local_1d0);
  if (validator_name->_M_string_length == 0) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    poVar1 = ::std::operator<<(local_1a0,"INT");
    poVar1 = ::std::operator<<(poVar1," in [");
    poVar1 = (ostream *)::std::ostream::operator<<((ostream *)poVar1,min_val);
    poVar1 = ::std::operator<<(poVar1," - ");
    poVar1 = (ostream *)::std::ostream::operator<<((ostream *)poVar1,max_val);
    ::std::operator<<(poVar1,"]");
    ::std::__cxx11::stringbuf::str();
    Validator::description(&this->super_Validator,&local_1f0);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  }
  local_1b0[0].min_val = min_val;
  local_1b0[0].max_val = max_val;
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,local_1b0);
  return;
}

Assistant:

Range(T min_val, T max_val, const std::string &validator_name = std::string{}) : Validator(validator_name) {
        if(validator_name.empty()) {
            std::stringstream out;
            out << detail::type_name<T>() << " in [" << min_val << " - " << max_val << "]";
            description(out.str());
        }

        func_ = [min_val, max_val](std::string &input) {
            using CLI::detail::lexical_cast;
            T val;
            bool converted = lexical_cast(input, val);
            if((!converted) || (val < min_val || val > max_val)) {
                std::stringstream out;
                out << "Value " << input << " not in range [";
                out << min_val << " - " << max_val << "]";
                return out.str();
            }
            return std::string{};
        };
    }